

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O3

string * __thiscall Ratio::toStringCombType_abi_cxx11_(string *__return_storage_ptr__,Ratio *this)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  pointer pPVar5;
  ostringstream ss;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{",1);
  pPVar5 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar5) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      iVar1 = PhyloTreeEdge::getOriginalID
                        ((PhyloTreeEdge *)
                         ((long)&(pPVar5->super_Bipartition)._vptr_Bipartition + lVar4));
      std::ostream::operator<<((ostream *)local_1a8,iVar1);
      pPVar5 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar2 = ((long)(this->eEdges).
                     super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pPVar5 >> 3) * -0x71c71c71c71c71c7;
      if (uVar3 < uVar2 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
        pPVar5 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar2 = ((long)(this->eEdges).
                       super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pPVar5 >> 3) * -0x71c71c71c71c71c7;
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x48;
    } while (uVar3 < uVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}/{",3);
  pPVar5 = (this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar5) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      iVar1 = PhyloTreeEdge::getOriginalID
                        ((PhyloTreeEdge *)
                         ((long)&(pPVar5->super_Bipartition)._vptr_Bipartition + lVar4));
      std::ostream::operator<<((ostream *)local_1a8,iVar1);
      pPVar5 = (this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar2 = ((long)(this->fEdges).
                     super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pPVar5 >> 3) * -0x71c71c71c71c71c7;
      if (uVar3 < uVar2 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
        pPVar5 = (this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar2 = ((long)(this->fEdges).
                       super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pPVar5 >> 3) * -0x71c71c71c71c71c7;
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x48;
    } while (uVar3 < uVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string Ratio::toStringCombType() {
    ostringstream ss;
    ss << "{";

    for (size_t i = 0; i < eEdges.size(); i++) {
        ss << eEdges[i].getOriginalID();
        if (i < eEdges.size() - 1) {
            ss << ",";
        }
    }
    ss << "}/{";

    for (size_t i = 0; i < fEdges.size(); i++) {
        ss << fEdges[i].getOriginalID();
        if (i < fEdges.size() - 1) {
            ss << ",";
        }
    }
    ss << "}";
    return ss.str();
}